

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g2d.c
# Opt level: O3

void g2d_polygon_closest_boundary_point(zarray_t *poly,double *q,double *p)

{
  long lVar1;
  double *pdVar2;
  float fVar3;
  long lVar4;
  uint uVar5;
  long lVar6;
  float fVar7;
  double dVar8;
  undefined1 auVar9 [16];
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar14;
  undefined1 auVar13 [16];
  double dVar15;
  double dVar16;
  
  if (poly == (zarray_t *)0x0) {
    __assert_fail("za != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/christianrauch[P]apriltag2/./common/zarray.h"
                  ,0x84,"int zarray_size(const zarray_t *)");
  }
  lVar4 = (long)poly->size;
  if (0 < lVar4) {
    fVar3 = INFINITY;
    lVar6 = 0;
    do {
      if (poly->size <= lVar6) {
LAB_003c519c:
        __assert_fail("idx < za->size",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/christianrauch[P]apriltag2/./common/zarray.h"
                      ,0xd9,"void zarray_get_volatile(const zarray_t *, int, void *)");
      }
      lVar1 = lVar6 + 1;
      uVar5 = (uint)lVar1;
      if (lVar4 + -1 == lVar6) {
        uVar5 = 0;
      }
      if ((uint)poly->size <= uVar5) goto LAB_003c519c;
      pdVar2 = (double *)(poly->data + lVar6 * poly->el_sz);
      dVar12 = *pdVar2;
      dVar15 = pdVar2[1];
      pdVar2 = (double *)(poly->data + (ulong)uVar5 * poly->el_sz);
      dVar11 = *pdVar2 - dVar12;
      dVar14 = pdVar2[1] - dVar15;
      auVar9._8_8_ = dVar14;
      auVar9._0_8_ = dVar11;
      auVar13._0_8_ = (double)SQRT((float)(dVar14 * dVar14 + dVar11 * dVar11));
      auVar13._8_8_ = auVar13._0_8_;
      auVar9 = divpd(auVar9,auVar13);
      dVar8 = auVar9._0_8_;
      dVar10 = auVar9._8_8_;
      dVar16 = dVar8 * (dVar12 - dVar12) + dVar10 * (dVar15 - dVar15);
      dVar14 = dVar8 * dVar11 + dVar10 * dVar14;
      dVar11 = dVar14;
      if (dVar14 <= dVar16) {
        dVar11 = dVar16;
        dVar16 = dVar14;
      }
      dVar14 = (*q - dVar12) * dVar8 + (q[1] - dVar15) * dVar10;
      if (dVar14 <= dVar11) {
        dVar11 = dVar14;
      }
      dVar16 = (double)(~-(ulong)(dVar14 < dVar16) & (ulong)dVar11 |
                       (ulong)dVar16 & -(ulong)(dVar14 < dVar16));
      dVar12 = dVar16 * dVar8 + dVar12;
      dVar15 = dVar16 * dVar10 + dVar15;
      dVar16 = *q - dVar12;
      dVar11 = q[1] - dVar15;
      fVar7 = SQRT((float)(dVar11 * dVar11 + dVar16 * dVar16));
      if (fVar7 < fVar3) {
        *p = dVar12;
        p[1] = dVar15;
        fVar3 = fVar7;
      }
      lVar6 = lVar1;
    } while (lVar4 != lVar1);
  }
  return;
}

Assistant:

void g2d_polygon_closest_boundary_point(const zarray_t *poly, const double q[2], double *p)
{
    int psz = zarray_size(poly);
    double min_dist = HUGE_VALF;

    for (int i = 0; i < psz; i++) {
        double *p0, *p1;

        zarray_get_volatile(poly, i, &p0);
        zarray_get_volatile(poly, (i+1) % psz, &p1);

        g2d_line_segment_t seg;
        g2d_line_segment_init_from_points(&seg, p0, p1);

        double thisp[2];
        g2d_line_segment_closest_point(&seg, q, thisp);

        double dist = g2d_distance(q, thisp);
        if (dist < min_dist) {
            memcpy(p, thisp, sizeof(double[2]));
            min_dist = dist;
        }
    }
}